

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O0

void __thiscall
flow_cutter::MultiCutter::
init<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch,flow_cutter::PierceNodeScore>
          (MultiCutter *this,
          Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
          *graph,TemporaryData *tmp,BreadthFirstSearch *search_algo,
          PierceNodeScore *score_pierce_node,DistanceType dist_type,
          vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_> *p,
          int max_flow_intensity,int random_seed,bool should_skip_non_maximum_sides)

{
  SourceTargetPair p_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  reference this_00;
  vector<int,_std::allocator<int>_> *pvVar7;
  DistanceAwareCutter *in_RCX;
  DistanceAwareCutter *in_RDX;
  Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
  *in_RSI;
  vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
  *in_RDI;
  int in_R9D;
  vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
  *in_stack_00000008;
  int in_stack_00000018;
  byte in_stack_00000020;
  value_type *x_1;
  int i_1;
  int best_cutter_weight;
  int best_cut_size;
  int best_cutter_id;
  anon_class_16_2_0ed2c766 my_score_pierce_node;
  value_type *x;
  int i;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  DistanceType in_stack_ffffffffffffff4c;
  vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
  *in_stack_ffffffffffffff50;
  Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
  *graph_00;
  DistanceAwareCutter *this_01;
  DistanceAwareCutter *this_02;
  int iVar8;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_34;
  
  while( true ) {
    sVar4 = std::
            vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
            ::size(in_RDI);
    sVar5 = std::
            vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>::
            size(in_stack_00000008);
    if (sVar4 <= sVar5) break;
    std::vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
    ::pop_back((vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                *)0x17c6af);
  }
  while( true ) {
    sVar5 = std::
            vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
            ::size(in_RDI);
    sVar6 = std::
            vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>::
            size(in_stack_00000008);
    if (sVar6 <= sVar5) break;
    std::vector<flow_cutter::DistanceAwareCutter,std::allocator<flow_cutter::DistanceAwareCutter>>::
    emplace_back<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>const&>
              (in_stack_ffffffffffffff50,
               (Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
                *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  local_34 = 0;
  while (iVar3 = local_34,
        sVar5 = std::
                vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
                ::size(in_stack_00000008), iVar3 < (int)sVar5) {
    this_00 = std::
              vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
              ::operator[](in_RDI,(long)local_34);
    graph_00 = in_RSI;
    this_01 = in_RDX;
    this_02 = in_RCX;
    iVar8 = in_R9D;
    std::vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>::
    operator[](in_stack_00000008,(long)local_34);
    iVar2 = in_stack_00000018 + 1 + local_34;
    p_00.target = iVar3;
    p_00.source = iVar8;
    DistanceAwareCutter::
    init<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch>
              (this_02,(Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
                        *)this_01,(TemporaryData *)graph_00,(BreadthFirstSearch *)this_00,
               in_stack_ffffffffffffff4c,p_00,(int)sVar4,(int)in_RDI);
    if ((in_stack_00000020 & 1) != 0) {
      while (bVar1 = DistanceAwareCutter::
                     does_next_advance_increase_cut<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::MultiCutter::init<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch,flow_cutter::PierceNodeScore>(flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>const&,flow_cutter::TemporaryData&,flow_cutter::BreadthFirstSearch_const&,flow_cutter::PierceNodeScore_const&,flow_cutter::DistanceType,std::vector<flow_cutter::SourceTargetPair,std::allocator<flow_cutter::SourceTargetPair>>const&,int,int,bool)::_lambda(int,int,bool,int,int)_1_>
                               (this_00,(Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
                                         *)CONCAT44(in_stack_ffffffffffffff4c,
                                                    in_stack_ffffffffffffff48),
                                (anon_class_16_2_0ed2c766 *)
                                CONCAT44(in_stack_ffffffffffffff44,iVar2)),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        DistanceAwareCutter::
        advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch,flow_cutter::MultiCutter::init<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch,flow_cutter::PierceNodeScore>(flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>const&,flow_cutter::TemporaryData&,flow_cutter::BreadthFirstSearch_const&,flow_cutter::PierceNodeScore_const&,flow_cutter::DistanceType,std::vector<flow_cutter::SourceTargetPair,std::allocator<flow_cutter::SourceTargetPair>>const&,int,int,bool)::_lambda(int,int,bool,int,int)_1_>
                  (this_01,graph_00,(TemporaryData *)this_00,
                   (BreadthFirstSearch *)
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (anon_class_16_2_0ed2c766 *)CONCAT44(in_stack_ffffffffffffff44,iVar2));
      }
    }
    local_34 = local_34 + 1;
  }
  local_5c = -1;
  local_60 = std::numeric_limits<int>::max();
  local_64 = 0;
  local_68 = 0;
  do {
    iVar3 = local_68;
    sVar4 = std::
            vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>::
            size(in_stack_00000008);
    if ((int)sVar4 <= iVar3) {
      *(int *)((long)&in_RDI[1].
                      super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                      ._M_impl.super__Vector_impl_data._M_start + 4) = local_5c;
      std::
      vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>::
      operator[](in_RDI,(long)*(int *)((long)&in_RDI[1].
                                              super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 4));
      iVar3 = DistanceAwareCutter::get_current_smaller_cut_side_size
                        ((DistanceAwareCutter *)0x17c961);
      *(int *)&in_RDI[1].
               super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
               ._M_impl.super__Vector_impl_data._M_start = iVar3;
      return;
    }
    std::vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
    ::operator[](in_RDI,(long)local_68);
    pvVar7 = DistanceAwareCutter::get_current_cut((DistanceAwareCutter *)0x17c8d0);
    sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
    if ((int)sVar4 < local_60) {
LAB_0017c906:
      local_5c = local_68;
      pvVar7 = DistanceAwareCutter::get_current_cut((DistanceAwareCutter *)0x17c918);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
      local_60 = (int)sVar4;
      local_64 = DistanceAwareCutter::get_current_smaller_cut_side_size
                           ((DistanceAwareCutter *)0x17c92e);
    }
    else {
      pvVar7 = DistanceAwareCutter::get_current_cut((DistanceAwareCutter *)0x17c8e8);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
      if (((int)sVar4 == local_60) &&
         (iVar3 = DistanceAwareCutter::get_current_smaller_cut_side_size
                            ((DistanceAwareCutter *)0x17c900), local_64 < iVar3)) goto LAB_0017c906;
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

void init(const Graph& graph, TemporaryData& tmp,
        const SearchAlgorithm& search_algo,
        const ScorePierceNode& score_pierce_node, DistanceType dist_type,
        const std::vector<SourceTargetPair>& p, int max_flow_intensity, int random_seed,
        bool should_skip_non_maximum_sides = true)
    {
        while (cutter_list.size() > p.size())
            cutter_list.pop_back(); // can not use resize because that requires
                // default constructor...
        while (cutter_list.size() < p.size())
            cutter_list.emplace_back(graph);

        for (int i = 0; i < (int)p.size(); ++i) {
            auto& x = cutter_list[i];
            auto my_score_pierce_node = [&](int x, int side,
                                            bool causes_augmenting_path,
                                            int source_dist, int target_dist) {
                return score_pierce_node(x, side, causes_augmenting_path, source_dist,
                    target_dist, i);
            };

            x.init(graph, tmp, search_algo, dist_type, p[i], max_flow_intensity, random_seed + 1 + i);
            if (should_skip_non_maximum_sides)
                while (!x.does_next_advance_increase_cut(graph, my_score_pierce_node))
                    x.advance(graph, tmp, search_algo, my_score_pierce_node);
        }

        int best_cutter_id = -1;
        int best_cut_size = std::numeric_limits<int>::max();
        int best_cutter_weight = 0;

        for (int i = 0; i < (int)p.size(); ++i) {
            auto& x = cutter_list[i];
            if ((int)x.get_current_cut().size() < best_cut_size || ((int)x.get_current_cut().size() == best_cut_size && x.get_current_smaller_cut_side_size() > best_cutter_weight)) {
                best_cutter_id = i;
                best_cut_size = x.get_current_cut().size();
                best_cutter_weight = x.get_current_smaller_cut_side_size();
            }
        }

        current_cutter_id = best_cutter_id;
        current_smaller_side_size = cutter_list[current_cutter_id].get_current_smaller_cut_side_size();
    }